

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureClampTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::SparseTextureClampLookupResidencyTestCase::verifyLookupTextureData
          (SparseTextureClampLookupResidencyTestCase *this,Functions *gl,GLint target,GLint format,
          GLuint *texture,GLint level,FunctionToken *funcToken)

{
  pointer __s;
  pointer puVar1;
  GLenum GVar2;
  ostream *poVar3;
  ulong uVar4;
  TestError *this_00;
  int iVar5;
  ulong uVar6;
  undefined1 *puVar7;
  ulong uVar8;
  GLint x;
  ulong uVar9;
  Functions *gl_00;
  bool bVar10;
  size_type __new_size;
  GLuint verifyTexture;
  GLint depth;
  GLint height;
  GLint width;
  allocator<char> local_64a;
  allocator<char> local_649;
  GLint local_648;
  int local_644;
  SparseTexture2LookupTestCase *local_640;
  Functions *local_638;
  int local_62c;
  GLint local_628;
  GLuint fbo;
  ulong local_620;
  string fragment;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vecOutData;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vecExpData;
  string vertex;
  string local_580;
  ProgramSources sources;
  FunctionToken f;
  ShaderProgram program;
  TokenStringsExt s;
  
  puVar7 = &(this->super_SparseTexture2LookupTestCase).super_SparseTexture2CommitmentTestCase.
            super_SparseTextureCommitmentTestCase.field_0x88;
  local_648 = format;
  local_638 = gl;
  poVar3 = std::operator<<((ostream *)puVar7,"Verify Lookup Residency Texture Data [function: ");
  poVar3 = std::operator<<(poVar3,(string *)funcToken);
  poVar3 = std::operator<<(poVar3,", level: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,level);
  std::operator<<(poVar3,"] - ");
  if (level <= (this->super_SparseTexture2LookupTestCase).super_SparseTexture2CommitmentTestCase.
               super_SparseTextureCommitmentTestCase.mState.levels + -1) {
    SparseTextureUtils::getTextureLevelSize
              (target,&(this->super_SparseTexture2LookupTestCase).
                       super_SparseTexture2CommitmentTestCase.super_SparseTextureCommitmentTestCase.
                       mState,level,&width,&height,&depth);
    local_62c = width / 2;
    bVar10 = true;
    if ((height != 0 && 2 < width + 1U) &&
       ((this->super_SparseTexture2LookupTestCase).super_SparseTexture2CommitmentTestCase.
        super_SparseTextureCommitmentTestCase.mState.minDepth <= depth)) {
      if (target == 0x8513) {
        depth = depth * 6;
      }
      vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      __new_size = (size_type)(height * width);
      local_628 = level;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&vecExpData,__new_size);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&vecOutData,__new_size);
      puVar1 = vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      __s = vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start;
      memset(vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,0xff,__new_size);
      SparseTexture2LookupTestCase::FunctionToken::FunctionToken(&f,funcToken);
      gl_00 = local_638;
      gl4cts::Texture::Generate(local_638,&verifyTexture);
      gl4cts::Texture::Bind(gl_00,verifyTexture,0xde1);
      gl4cts::Texture::Storage(gl_00,0xde1,1,0x8229,width,height,depth);
      GVar2 = (*gl_00->getError)();
      glu::checkError(GVar2,"Texture::Storage",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                      ,0x148);
      local_640 = &this->super_SparseTexture2LookupTestCase;
      (*gl_00->genFramebuffers)(1,&fbo);
      GVar2 = (*gl_00->getError)();
      glu::checkError(GVar2,"glGenFramebuffers",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                      ,0x14c);
      (*gl_00->bindFramebuffer)(0x8d40,fbo);
      GVar2 = (*gl_00->getError)();
      glu::checkError(GVar2,"glBindFramebuffer",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                      ,0x14e);
      (*gl_00->framebufferTexture2D)(0x8d40,0x8ce0,0xde1,verifyTexture,0);
      GVar2 = (*gl_00->getError)();
      glu::checkError(GVar2,"glFramebufferTexture2D",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                      ,0x150);
      (*gl_00->viewport)(0,0,width,height);
      bVar10 = true;
      uVar9 = 0;
      while ((int)uVar9 < depth) {
        iVar5 = 0;
        local_620 = uVar9;
        while (iVar5 < (((SparseTexture2LookupTestCase *)
                        &local_640->super_SparseTexture2CommitmentTestCase)->
                       super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase
                       .mState.samples) {
          local_644 = iVar5;
          memset(__s,0,__new_size);
          gl4cts::Texture::Bind(gl_00,verifyTexture,0xde1);
          gl4cts::Texture::SubImage(gl_00,0xde1,0,0,0,0,width,height,0,0x1903,0x1401,__s);
          GVar2 = (*gl_00->getError)();
          glu::checkError(GVar2,"Texture::SubImage",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                          ,0x15d);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&vertex,stc_vertex_common,(allocator<char> *)&s);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&fragment,stc_fragment_lookupResidency,(allocator<char> *)&s);
          SparseTexture2LookupTestCase::createLookupShaderTokens
                    (&s,local_640,target,local_648,local_628,local_644,&f);
          replaceToken("<COORD_TYPE>",s.coordType._M_dataplus._M_p,&vertex);
          replaceToken("<FUNCTION>",f.name._M_dataplus._M_p,&fragment);
          replaceToken("<ARGUMENTS>",f.arguments._M_dataplus._M_p,&fragment);
          replaceToken("<OUTPUT_TYPE>",s.super_TokenStrings.outputType._M_dataplus._M_p,&fragment);
          replaceToken("<INPUT_TYPE>",s.super_TokenStrings.inputType._M_dataplus._M_p,&fragment);
          replaceToken("<SIZE_DEF>",s.sizeDef._M_dataplus._M_p,&fragment);
          replaceToken("<LOD>",s.lod._M_dataplus._M_p,&fragment);
          replaceToken("<LOD_DEF>",s.lodDef._M_dataplus._M_p,&fragment);
          replaceToken("<COORD_TYPE>",s.coordType._M_dataplus._M_p,&fragment);
          replaceToken("<ICOORD_TYPE>",s.iCoordType._M_dataplus._M_p,&fragment);
          replaceToken("<COORD_DEF>",s.coordDef._M_dataplus._M_p,&fragment);
          replaceToken("<POINT_TYPE>",s.super_TokenStrings.pointType._M_dataplus._M_p,&fragment);
          replaceToken("<POINT_DEF>",s.super_TokenStrings.pointDef._M_dataplus._M_p,&fragment);
          replaceToken("<RETURN_TYPE>",s.super_TokenStrings.returnType._M_dataplus._M_p,&fragment);
          replaceToken("<RESULT_EXPECTED>",s.super_TokenStrings.resultExpected._M_dataplus._M_p,
                       &fragment);
          replaceToken("<EPSILON>",s.super_TokenStrings.epsilon._M_dataplus._M_p,&fragment);
          replaceToken("<SAMPLE_DEF>",s.super_TokenStrings.sampleDef._M_dataplus._M_p,&fragment);
          replaceToken("<REFZ_DEF>",s.refZDef._M_dataplus._M_p,&fragment);
          replaceToken("<POINT_COORD>",s.pointCoord._M_dataplus._M_p,&fragment);
          replaceToken("<COMPONENT_DEF>",s.componentDef._M_dataplus._M_p,&fragment);
          replaceToken("<CUBE_MAP_COORD_DEF>",s.cubeMapCoordDef._M_dataplus._M_p,&fragment);
          replaceToken("<OFFSET_ARRAY_DEF>",s.offsetArrayDef._M_dataplus._M_p,&fragment);
          replaceToken("<FORMAT_DEF>",s.formatDef._M_dataplus._M_p,&fragment);
          replaceToken("<OFFSET_TYPE>",s.offsetType._M_dataplus._M_p,&fragment);
          replaceToken("<NOFFSET_TYPE>",s.nOffsetType._M_dataplus._M_p,&fragment);
          replaceToken("<OFFSET_DIM>",s.offsetDim._M_dataplus._M_p,&fragment);
          de::toString<int>((string *)&sources,&width);
          replaceToken("<TEX_WIDTH>",
                       (GLchar *)
                       sources.sources[0].
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,&fragment);
          std::__cxx11::string::~string((string *)&sources);
          de::toString<int>((string *)&sources,&height);
          replaceToken("<TEX_HEIGHT>",
                       (GLchar *)
                       sources.sources[0].
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,&fragment);
          std::__cxx11::string::~string((string *)&sources);
          de::toString<int>((string *)&sources,&depth);
          replaceToken("<TEX_DEPTH>",
                       (GLchar *)
                       sources.sources[0].
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,&fragment);
          std::__cxx11::string::~string((string *)&sources);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&program,vertex._M_dataplus._M_p,&local_649);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_580,fragment._M_dataplus._M_p,&local_64a);
          glu::makeVtxFragSources(&sources,(string *)&program,&local_580);
          std::__cxx11::string::~string((string *)&local_580);
          std::__cxx11::string::~string((string *)&program);
          glu::ShaderProgram::ShaderProgram
                    (&program,((((SparseTexture2LookupTestCase *)
                                &local_640->super_SparseTexture2CommitmentTestCase)->
                               super_SparseTexture2CommitmentTestCase).
                               super_SparseTextureCommitmentTestCase.super_TestCase.m_context)->
                              m_renderCtx,&sources);
          gl_00 = local_638;
          if (program.m_program.m_info.linkOk == true) {
            (*local_638->useProgram)(program.m_program.m_program);
            GVar2 = (*gl_00->getError)();
            glu::checkError(GVar2,"glUseProgram",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                            ,0x18d);
            (*gl_00->activeTexture)(0x84c0);
            GVar2 = (*gl_00->getError)();
            glu::checkError(GVar2,"glActiveTexture",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                            ,0x191);
            (*gl_00->uniform1i)(1,0);
            GVar2 = (*gl_00->getError)();
            glu::checkError(GVar2,"glUniform1i",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                            ,0x193);
            (*gl_00->uniform1i)(2,local_62c);
            GVar2 = (*gl_00->getError)();
            glu::checkError(GVar2,"glUniform1i",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                            ,0x197);
            (*gl_00->bindTexture)(target,*texture);
            GVar2 = (*gl_00->getError)();
            glu::checkError(GVar2,"glBindTexture",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                            ,0x19a);
            (*gl_00->clear)(0x4100);
            (**(code **)((long)(((SparseTexture2LookupTestCase *)
                                &local_640->super_SparseTexture2CommitmentTestCase)->
                               super_SparseTexture2CommitmentTestCase).
                               super_SparseTextureCommitmentTestCase.super_TestCase.super_TestCase.
                               super_TestNode._vptr_TestNode + 0xa0))
                      (local_640,target,local_620,&program);
            gl4cts::Texture::Bind(gl_00,verifyTexture,0xde1);
            gl4cts::Texture::GetData(gl_00,0,0xde1,0x1903,0x1401,__s);
            GVar2 = (*gl_00->getError)();
            glu::checkError(GVar2,"Texture::GetData",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                            ,0x1a1);
            uVar9 = 0;
            uVar6 = 0;
            if (0 < width) {
              uVar6 = (ulong)(uint)width;
            }
            uVar4 = (ulong)(uint)height;
            if (height < 1) {
              uVar4 = uVar9;
            }
            for (uVar8 = 0; uVar8 != uVar4; uVar8 = uVar8 + 1) {
              iVar5 = (int)uVar9;
              for (uVar9 = 0; uVar6 != uVar9; uVar9 = uVar9 + 1) {
                bVar10 = (bool)(bVar10 & puVar1[uVar9 + (long)iVar5] == __s[uVar9 + (long)iVar5]);
              }
              uVar9 = (ulong)(uint)(iVar5 + width);
            }
          }
          else {
            poVar3 = std::operator<<((ostream *)puVar7,
                                     "Shader compilation failed (lookup residency) for target: ");
            gl_00 = local_638;
            poVar3 = (ostream *)std::ostream::operator<<(poVar3,target);
            poVar3 = std::operator<<(poVar3,", format: ");
            poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_648);
            poVar3 = std::operator<<(poVar3,", vertexInfoLog: ");
            poVar3 = std::operator<<(poVar3,(string *)
                                            &((*program.m_shaders[0].
                                                super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->m_info).
                                             infoLog);
            poVar3 = std::operator<<(poVar3,", fragmentInfoLog: ");
            poVar3 = std::operator<<(poVar3,(string *)
                                            &((*program.m_shaders[1].
                                                super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->m_info).
                                             infoLog);
            poVar3 = std::operator<<(poVar3,", programInfoLog: ");
            poVar3 = std::operator<<(poVar3,(string *)&program.m_program.m_info);
            poVar3 = std::operator<<(poVar3,", fragmentSource: ");
            poVar3 = std::operator<<(poVar3,fragment._M_dataplus._M_p);
            std::operator<<(poVar3," - ");
            bVar10 = false;
          }
          glu::ShaderProgram::~ShaderProgram(&program);
          glu::ProgramSources::~ProgramSources(&sources);
          SparseTexture2LookupTestCase::TokenStringsExt::~TokenStringsExt(&s);
          std::__cxx11::string::~string((string *)&fragment);
          std::__cxx11::string::~string((string *)&vertex);
          iVar5 = local_644 + 1;
        }
        uVar9 = (ulong)((int)local_620 + 1);
      }
      (*gl_00->bindFramebuffer)(0x8d40,0);
      GVar2 = (*gl_00->getError)();
      glu::checkError(GVar2,"glBindFramebuffer",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                      ,0x1bb);
      gl4cts::Texture::Delete(gl_00,&verifyTexture);
      SparseTexture2LookupTestCase::FunctionToken::~FunctionToken(&f);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    }
    return bVar10;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Invalid level",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
             ,0x121);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

bool SparseTextureClampLookupResidencyTestCase::verifyLookupTextureData(const Functions& gl, GLint target, GLint format,
																		GLuint& texture, GLint level,
																		FunctionToken& funcToken)
{
	mLog << "Verify Lookup Residency Texture Data [function: " << funcToken.name << ", level: " << level << "] - ";

	if (level > mState.levels - 1)
		TCU_FAIL("Invalid level");

	GLint width;
	GLint height;
	GLint depth;
	SparseTextureUtils::getTextureLevelSize(target, mState, level, width, height, depth);

	//Committed region is limited to 1/2 of width
	GLint widthCommitted = width / 2;

	if (widthCommitted == 0 || height == 0 || depth < mState.minDepth)
		return true;

	bool result = true;

	if (target == GL_TEXTURE_CUBE_MAP)
		depth = depth * 6;

	GLint texSize = width * height;

	std::vector<GLubyte> vecExpData;
	std::vector<GLubyte> vecOutData;
	vecExpData.resize(texSize);
	vecOutData.resize(texSize);
	GLubyte* exp_data = vecExpData.data();
	GLubyte* out_data = vecOutData.data();

	// Expected data is 255 because
	deMemset(exp_data, 255, texSize);

	// Make token copy to work on
	FunctionToken f = funcToken;

	// Create verifying texture
	GLint  verifyTarget = GL_TEXTURE_2D;
	GLuint verifyTexture;
	Texture::Generate(gl, verifyTexture);
	Texture::Bind(gl, verifyTexture, verifyTarget);
	Texture::Storage(gl, verifyTarget, 1, GL_R8, width, height, depth);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Texture::Storage");

	GLuint fbo;
	gl.genFramebuffers(1, &fbo);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenFramebuffers");
	gl.bindFramebuffer(GL_FRAMEBUFFER, fbo);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer");
	gl.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, verifyTarget, verifyTexture, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferTexture2D");

	gl.viewport(0, 0, width, height);

	for (GLint z = 0; z < depth; ++z)
	{
		for (int sample = 0; sample < mState.samples; ++sample)
		{
			deMemset(out_data, 0, texSize);

			Texture::Bind(gl, verifyTexture, verifyTarget);
			Texture::SubImage(gl, verifyTarget, 0, 0, 0, 0, width, height, 0, GL_RED, GL_UNSIGNED_BYTE,
							  (GLvoid*)out_data);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Texture::SubImage");

			std::string vertex   = stc_vertex_common;
			std::string fragment = stc_fragment_lookupResidency;

			// Adjust shader source to texture format
			TokenStringsExt s = createLookupShaderTokens(target, format, level, sample, f);

			replaceToken("<COORD_TYPE>", s.coordType.c_str(), vertex);

			replaceToken("<FUNCTION>", f.name.c_str(), fragment);
			replaceToken("<ARGUMENTS>", f.arguments.c_str(), fragment);

			replaceToken("<OUTPUT_TYPE>", s.outputType.c_str(), fragment);
			replaceToken("<INPUT_TYPE>", s.inputType.c_str(), fragment);
			replaceToken("<SIZE_DEF>", s.sizeDef.c_str(), fragment);
			replaceToken("<LOD>", s.lod.c_str(), fragment);
			replaceToken("<LOD_DEF>", s.lodDef.c_str(), fragment);
			replaceToken("<COORD_TYPE>", s.coordType.c_str(), fragment);
			replaceToken("<ICOORD_TYPE>", s.iCoordType.c_str(), fragment);
			replaceToken("<COORD_DEF>", s.coordDef.c_str(), fragment);
			replaceToken("<POINT_TYPE>", s.pointType.c_str(), fragment);
			replaceToken("<POINT_DEF>", s.pointDef.c_str(), fragment);
			replaceToken("<RETURN_TYPE>", s.returnType.c_str(), fragment);
			replaceToken("<RESULT_EXPECTED>", s.resultExpected.c_str(), fragment);
			replaceToken("<EPSILON>", s.epsilon.c_str(), fragment);
			replaceToken("<SAMPLE_DEF>", s.sampleDef.c_str(), fragment);
			replaceToken("<REFZ_DEF>", s.refZDef.c_str(), fragment);
			replaceToken("<POINT_COORD>", s.pointCoord.c_str(), fragment);
			replaceToken("<COMPONENT_DEF>", s.componentDef.c_str(), fragment);
			replaceToken("<CUBE_MAP_COORD_DEF>", s.cubeMapCoordDef.c_str(), fragment);
			replaceToken("<OFFSET_ARRAY_DEF>", s.offsetArrayDef.c_str(), fragment);
			replaceToken("<FORMAT_DEF>", s.formatDef.c_str(), fragment);
			replaceToken("<OFFSET_TYPE>", s.offsetType.c_str(), fragment);
			replaceToken("<NOFFSET_TYPE>", s.nOffsetType.c_str(), fragment);
			replaceToken("<OFFSET_DIM>", s.offsetDim.c_str(), fragment);

			replaceToken("<TEX_WIDTH>", de::toString(width).c_str(), fragment);
			replaceToken("<TEX_HEIGHT>", de::toString(height).c_str(), fragment);
			replaceToken("<TEX_DEPTH>", de::toString(depth).c_str(), fragment);

			ProgramSources sources = makeVtxFragSources(vertex.c_str(), fragment.c_str());

			// Build and run shader
			ShaderProgram program(m_context.getRenderContext(), sources);
			if (program.isOk())
			{
				gl.useProgram(program.getProgram());
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram");

				// Pass input sampler/image to shader
				gl.activeTexture(GL_TEXTURE0);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glActiveTexture");
				gl.uniform1i(1, 0 /* sampler_unit */);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i");

				// Pass committed region width to shader
				gl.uniform1i(2, widthCommitted /* committed region width */);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i");

				gl.bindTexture(target, texture);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture");

				gl.clear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
				draw(target, z, program);

				Texture::Bind(gl, verifyTexture, verifyTarget);
				Texture::GetData(gl, 0, verifyTarget, GL_RED, GL_UNSIGNED_BYTE, (GLvoid*)out_data);
				GLU_EXPECT_NO_ERROR(gl.getError(), "Texture::GetData");

				//Verify only committed region
				for (GLint y = 0; y < height; ++y)
					for (GLint x = 0; x < width; ++x)
					{
						GLubyte* dataRegion	= exp_data + x + y * width;
						GLubyte* outDataRegion = out_data + x + y * width;
						if (dataRegion[0] != outDataRegion[0])
							result = false;
					}
			}
			else
			{
				mLog << "Shader compilation failed (lookup residency) for target: " << target << ", format: " << format
					 << ", vertexInfoLog: " << program.getShaderInfo(SHADERTYPE_VERTEX).infoLog
					 << ", fragmentInfoLog: " << program.getShaderInfo(SHADERTYPE_FRAGMENT).infoLog
					 << ", programInfoLog: " << program.getProgramInfo().infoLog
					 << ", fragmentSource: " << fragment.c_str() << " - ";

				result = false;
			}
		}
	}

	gl.bindFramebuffer(GL_FRAMEBUFFER, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer");

	Texture::Delete(gl, verifyTexture);

	return result;
}